

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDLoad(TranslateToFuzzReader *this)

{
  Random *this_00;
  double dVar1;
  undefined8 uVar2;
  uintptr_t uVar3;
  int8_t iVar4;
  SIMDLoadOp SVar5;
  int iVar6;
  Expression *pEVar7;
  Expression *pEVar8;
  long lVar9;
  
  this_00 = &this->random;
  lVar9 = 0;
  SVar5 = Random::
          pick<wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp>
                    (this_00,Load8SplatVec128,Load16SplatVec128,Load32SplatVec128,Load64SplatVec128,
                     Load8x8SVec128,Load8x8UVec128,Load16x4SVec128,Load16x4UVec128,Load32x2SVec128,
                     Load32x2UVec128,Load32ZeroVec128,Load64ZeroVec128);
  iVar4 = Random::get(this_00);
  dVar1 = log((double)(iVar4 + 1 + (uint)(iVar4 == -1)));
  switch(SVar5) {
  case Load8SplatVec128:
    lVar9 = 1;
    break;
  case Load16SplatVec128:
    iVar6 = Random::pick<int,int>(this_00,1,2);
    goto LAB_001365e1;
  case Load32SplatVec128:
    iVar6 = Random::pick<int,int,int>(this_00,1,2,4);
    goto LAB_001365e1;
  case Load64SplatVec128:
  case Load8x8SVec128:
  case Load8x8UVec128:
  case Load16x4SVec128:
  case Load16x4UVec128:
  case Load32x2SVec128:
  case Load32x2UVec128:
    iVar6 = Random::pick<int,int,int,int>(this_00,1,2,4,8);
LAB_001365e1:
    lVar9 = (long)iVar6;
    break;
  case Load32ZeroVec128:
    lVar9 = 4;
    break;
  case Load64ZeroVec128:
    lVar9 = 8;
  }
  dVar1 = floor(dVar1);
  pEVar7 = makePointer(this);
  uVar2 = *(undefined8 *)**(long **)(this->wasm + 0x78);
  uVar3 = ((undefined8 *)**(long **)(this->wasm + 0x78))[1];
  pEVar8 = (Expression *)MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x40,8)
  ;
  pEVar8->_id = SIMDLoadId;
  (pEVar8->type).id = 0;
  *(SIMDLoadOp *)(pEVar8 + 1) = SVar5;
  pEVar8[1].type.id = (long)dVar1 & 0xffffffff;
  *(long *)(pEVar8 + 2) = lVar9;
  pEVar8[2].type.id = (uintptr_t)pEVar7;
  *(undefined8 *)(pEVar8 + 3) = uVar2;
  pEVar8[3].type.id = uVar3;
  wasm::SIMDLoad::finalize();
  return pEVar8;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDLoad() {
  SIMDLoadOp op = pick(Load8SplatVec128,
                       Load16SplatVec128,
                       Load32SplatVec128,
                       Load64SplatVec128,
                       Load8x8SVec128,
                       Load8x8UVec128,
                       Load16x4SVec128,
                       Load16x4UVec128,
                       Load32x2SVec128,
                       Load32x2UVec128,
                       Load32ZeroVec128,
                       Load64ZeroVec128);
  Address offset = logify(get());
  Address align;
  switch (op) {
    case Load8SplatVec128:
      align = 1;
      break;
    case Load16SplatVec128:
      align = pick(1, 2);
      break;
    case Load32SplatVec128:
      align = pick(1, 2, 4);
      break;
    case Load64SplatVec128:
    case Load8x8SVec128:
    case Load8x8UVec128:
    case Load16x4SVec128:
    case Load16x4UVec128:
    case Load32x2SVec128:
    case Load32x2UVec128:
      align = pick(1, 2, 4, 8);
      break;
    case Load32ZeroVec128:
      align = 4;
      break;
    case Load64ZeroVec128:
      align = 8;
      break;
  }
  Expression* ptr = makePointer();
  return builder.makeSIMDLoad(op, offset, align, ptr, wasm.memories[0]->name);
}